

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

long GetStreamReadAvailable(PaStream *s)

{
  char *format;
  int xrun;
  unsigned_long avail;
  int local_1c;
  unsigned_long local_18;
  
  paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                         ((PaAlsaStreamComponent *)((long)s + 0x288),&local_18,&local_1c);
  if (paUtilErr_ < 0) {
    format = 
    "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &stream->capture, &avail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4512\n"
    ;
  }
  else {
    if (local_1c == 0) {
      return local_18;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun((PaAlsaStream *)s);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'PaAlsaStream_HandleXrun( stream )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4515\n"
      ;
    }
    else {
      paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                             ((PaAlsaStreamComponent *)((long)s + 0x288),&local_18,&local_1c);
      if (paUtilErr_ < 0) {
        format = 
        "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &stream->capture, &avail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4516\n"
        ;
      }
      else {
        if (local_1c == 0) {
          return local_18;
        }
        paUtilErr_ = -0x26fd;
        format = 
        "Expression \'paInputOverflowed\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4518\n"
        ;
      }
    }
  }
  PaUtil_DebugPrint(format);
  return (long)paUtilErr_;
}

Assistant:

static signed long GetStreamReadAvailable( PaStream* s )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    unsigned long avail;
    int xrun;

    PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &stream->capture, &avail, &xrun ) );
    if( xrun )
    {
        PA_ENSURE( PaAlsaStream_HandleXrun( stream ) );
        PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &stream->capture, &avail, &xrun ) );
        if( xrun )
            PA_ENSURE( paInputOverflowed );
    }

    return (signed long)avail;

error:
    return result;
}